

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

void deqp::gles31::Functional::checkTextureTypeExtensions
               (ContextInfo *contextInfo,TextureType type,RenderContext *renderContext)

{
  bool bVar1;
  ContextType ctxType;
  NotSupportedError *this;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (type == TEXTURETYPE_BUFFER) {
    bVar1 = glu::ContextInfo::isExtensionSupported(contextInfo,"GL_EXT_texture_buffer");
    if (!bVar1) {
      ctxType.super_ApiType.m_bits =
           (ApiType)(*renderContext->_vptr_RenderContext[2])(renderContext);
      bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
      if (!bVar1) {
        this = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"GL_EXT_texture_buffer",&local_79);
        std::operator+(&local_58,"Test requires ",&local_78);
        std::operator+(&local_38,&local_58," extension");
        tcu::NotSupportedError::NotSupportedError(this,&local_38);
        __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
  }
  return;
}

Assistant:

static inline void checkTextureTypeExtensions (const glu::ContextInfo& contextInfo, TextureType type, const RenderContext& renderContext)
{
	if (type == TEXTURETYPE_BUFFER && !contextInfo.isExtensionSupported(s_texBufExtString) && !glu::contextSupports(renderContext.getType(), glu::ApiType::es(3, 2)))
		throw tcu::NotSupportedError("Test requires " + string(s_texBufExtString) + " extension");
}